

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O1

void __thiscall hnsw::HNSWIndex::SearchUpperLayer(HNSWIndex *this,float *q,Point *ep,layer_t layer)

{
  long lVar1;
  uint *puVar2;
  bool bVar3;
  pair<unsigned_int,_float> *neighbor;
  uint *puVar4;
  float extraout_XMM0_Da;
  
  do {
    lVar1 = *(long *)&(this->vertices_).
                      super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start[ep->first].neighbors.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl;
    puVar4 = *(uint **)(lVar1 + (long)layer * 0x18);
    puVar2 = *(uint **)(lVar1 + 8 + (long)layer * 0x18);
    if (puVar4 == puVar2) {
      return;
    }
    bVar3 = false;
    do {
      (**this->distance_->_vptr_Distance)
                (this->distance_,q,
                 (this->points_).row_ptrs_.
                 super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                 super__Vector_impl_data._M_start[*puVar4]);
      if (extraout_XMM0_Da < ep->second) {
        ep->second = extraout_XMM0_Da;
        ep->first = *puVar4;
        bVar3 = true;
      }
      puVar4 = puVar4 + 2;
    } while (puVar4 != puVar2);
  } while (bVar3);
  return;
}

Assistant:

void SearchUpperLayer(const float *q, Point &ep, layer_t layer) {
    bool is_closer = true;
    while (is_closer) {
      is_closer = false;
      const auto &neighbors = vertices_[ep.first].neighbors[layer];
      for (const auto &neighbor : neighbors) {
        float dist = distance_(q, points_[neighbor.first]);
        if (dist < ep.second) {
          is_closer = true;
          ep.second = dist;
          ep.first = neighbor.first;
        }
      }
    }
  }